

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  undefined8 local_16;
  char s [10];
  
  s[2] = '\0';
  s[3] = '\0';
  s[4] = '\0';
  s[5] = '\0';
  local_16 = 0x7878787878007878;
  s[0] = 'x';
  s[1] = '\0';
  pcVar1 = strncat((char *)&local_16,"abcde",10);
  if (pcVar1 != (char *)&local_16) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2a,"strncat( s, abcde, 10 ) == s");
  }
  if (local_16._2_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2b,"s[2] == \'a\'");
  }
  if (local_16._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2c,"s[6] == \'e\'");
  }
  if (local_16._7_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2d,"s[7] == \'\\0\'");
  }
  if (s[0] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2e,"s[8] == \'x\'");
  }
  local_16 = local_16 & 0xffffffffffffff00;
  pcVar1 = strncat((char *)&local_16,"abcdx",10);
  if (pcVar1 != (char *)&local_16) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x30,"strncat( s, abcdx, 10 ) == s");
  }
  if (local_16._4_1_ != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x31,"s[4] == \'x\'");
  }
  if (local_16._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x32,"s[5] == \'\\0\'");
  }
  pcVar1 = strncat((char *)&local_16,"",10);
  if (pcVar1 != (char *)&local_16) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x33,"strncat( s, \"\\0\", 10 ) == s");
  }
  if (local_16._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x34,"s[5] == \'\\0\'");
  }
  if (local_16._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x35,"s[6] == \'e\'");
  }
  pcVar1 = strncat((char *)&local_16,"abcde",0);
  if (pcVar1 != (char *)&local_16) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x36,"strncat( s, abcde, 0 ) == s");
  }
  if (local_16._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x37,"s[5] == \'\\0\'");
  }
  if (local_16._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x38,"s[6] == \'e\'");
  }
  pcVar1 = strncat((char *)&local_16,"abcde",3);
  if (pcVar1 != (char *)&local_16) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x39,"strncat( s, abcde, 3 ) == s");
  }
  if (local_16._5_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3a,"s[5] == \'a\'");
  }
  if (local_16._7_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3b,"s[7] == \'c\'");
  }
  if (s[0] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3c,"s[8] == \'\\0\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "xx\0xxxxxx";
    TESTCASE( strncat( s, abcde, 10 ) == s );
    TESTCASE( s[2] == 'a' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( s[7] == '\0' );
    TESTCASE( s[8] == 'x' );
    s[0] = '\0';
    TESTCASE( strncat( s, abcdx, 10 ) == s );
    TESTCASE( s[4] == 'x' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strncat( s, "\0", 10 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 0 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 3 ) == s );
    TESTCASE( s[5] == 'a' );
    TESTCASE( s[7] == 'c' );
    TESTCASE( s[8] == '\0' );
    return TEST_RESULTS;
}